

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.c
# Opt level: O0

exr_result_t
exr_compress_buffer(int level,void *in,size_t in_bytes,void *out,size_t out_bytes_avail,
                   size_t *actual_out)

{
  long lVar1;
  long lVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  int in_EDI;
  undefined8 in_R8;
  long *in_R9;
  size_t outsz;
  libdeflate_compressor *comp;
  int local_8;
  exr_result_t local_4;
  
  local_8 = in_EDI;
  if ((in_EDI < 0) && (exr_get_default_zip_compression_level(&local_8), local_8 < 0)) {
    local_8 = 4;
  }
  lVar1 = libdeflate_alloc_compressor(local_8);
  if (lVar1 == 0) {
    local_4 = 1;
  }
  else {
    lVar2 = libdeflate_zlib_compress(lVar1,in_RSI,in_RDX,in_RCX,in_R8);
    libdeflate_free_compressor(lVar1);
    if (lVar2 == 0) {
      local_4 = 1;
    }
    else {
      if (in_R9 != (long *)0x0) {
        *in_R9 = lVar2;
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

exr_result_t exr_compress_buffer (
    int level,
    const void *in,
    size_t in_bytes,
    void *out,
    size_t out_bytes_avail,
    size_t *actual_out )
{
    struct libdeflate_compressor *comp;

    if (level < 0)
    {
        exr_get_default_zip_compression_level (&level);
        /* truly unset anywhere */
        if (level < 0)
            level = EXR_DEFAULT_ZLIB_COMPRESS_LEVEL;
    }

    comp = libdeflate_alloc_compressor (level);
    if (comp)
    {
        size_t outsz;
        outsz = libdeflate_zlib_compress (
            comp,
            in,
            in_bytes,
            out,
            out_bytes_avail);

        libdeflate_free_compressor (comp);

        if (outsz != 0)
        {
            if (actual_out)
                *actual_out = outsz;
            return EXR_ERR_SUCCESS;
        }
        return EXR_ERR_OUT_OF_MEMORY;
    }
    return EXR_ERR_OUT_OF_MEMORY;
}